

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

void __thiscall helics::TimeCoordinator::localError(TimeCoordinator *this)

{
  function<void_(const_helics::ActionMessage_&)> *pfVar1;
  pointer pDVar2;
  DependencyInfo *dep;
  pointer pDVar3;
  ActionMessage bye;
  ActionMessage multi;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if ((this->super_BaseTimeCoordinator).disconnected == false) {
    (this->time_granted).internalTimeCode = 0x7fffffffffffffff;
    (this->time_grantBase).internalTimeCode = 0x7fffffffffffffff;
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      if ((this->super_BaseTimeCoordinator).dependencies.dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->super_BaseTimeCoordinator).dependencies.dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      pfVar1 = &(this->super_BaseTimeCoordinator).sendMessageFunction;
      ActionMessage::ActionMessage(&local_1a0,cmd_local_error);
      local_1a0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(this->super_BaseTimeCoordinator).dependencies.dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 == 0x58) {
        if (((pDVar3->dependency == true) &&
            ((pDVar3->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff)) ||
           (pDVar3->dependent == true)) {
          local_1a0.dest_id.gid = (pDVar3->fedID).gid;
          if (local_1a0.dest_id.gid == local_1a0.source_id.gid) {
            (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(this,&local_1a0);
          }
          else {
            if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base.
                _M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                      ((_Any_data *)pfVar1,&local_1a0);
          }
        }
      }
      else {
        ActionMessage::ActionMessage(&local_e8,cmd_multi_message);
        pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pDVar3 != pDVar2) {
          do {
            if (((pDVar3->dependency == true) &&
                ((pDVar3->super_TimeData).next.internalTimeCode != 0x7fffffffffffffff)) ||
               (pDVar3->dependent == true)) {
              local_1a0.dest_id.gid = (pDVar3->fedID).gid;
              if (local_1a0.dest_id.gid == (this->super_BaseTimeCoordinator).mSourceId.gid) {
                (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(this,&local_1a0);
              }
              else {
                appendMessage(&local_e8,&local_1a0);
              }
            }
            pDVar3 = pDVar3 + 1;
          } while (pDVar3 != pDVar2);
        }
        if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
            (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                  ((_Any_data *)pfVar1,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
      }
      ActionMessage::~ActionMessage(&local_1a0);
    }
    (this->super_BaseTimeCoordinator).disconnected = true;
  }
  return;
}

Assistant:

void TimeCoordinator::localError()
{
    if (disconnected) {
        return;
    }
    time_granted = Time::maxVal();
    time_grantBase = Time::maxVal();
    if (sendMessageFunction) {
        if (dependencies.empty()) {
            return;
        }
        ActionMessage bye(CMD_LOCAL_ERROR);

        bye.source_id = mSourceId;
        if (dependencies.size() == 1) {
            auto& dep = *dependencies.begin();
            if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                bye.dest_id = dep.fedID;
                if (bye.dest_id == mSourceId) {
                    processTimeMessage(bye);
                } else {
                    sendMessageFunction(bye);
                }
            }

        } else {
            ActionMessage multi(CMD_MULTI_MESSAGE);
            for (const auto& dep : dependencies) {
                if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                    bye.dest_id = dep.fedID;
                    if (dep.fedID == mSourceId) {
                        processTimeMessage(bye);
                    } else {
                        appendMessage(multi, bye);
                    }
                }
            }
            sendMessageFunction(multi);
        }
    }
    disconnected = true;
}